

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

void __thiscall leveldb::VersionSet::AppendVersion(VersionSet *this,Version *v)

{
  long lVar1;
  Version *pVVar2;
  int iVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (v->refs_ != 0) {
    __assert_fail("v->refs_ == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/version_set.cc"
                  ,0x2fb,"void leveldb::VersionSet::AppendVersion(Version *)");
  }
  pVVar2 = this->current_;
  if (pVVar2 != v) {
    if (pVVar2 == (Version *)0x0) {
      iVar3 = 1;
    }
    else {
      Version::Unref(pVVar2);
      iVar3 = v->refs_ + 1;
    }
    this->current_ = v;
    v->refs_ = iVar3;
    pVVar2 = (this->dummy_versions_).prev_;
    v->prev_ = pVVar2;
    v->next_ = &this->dummy_versions_;
    pVVar2->next_ = v;
    v->next_->prev_ = v;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("v != current_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/version_set.cc"
                ,0x2fc,"void leveldb::VersionSet::AppendVersion(Version *)");
}

Assistant:

void VersionSet::AppendVersion(Version* v) {
  // Make "v" current
  assert(v->refs_ == 0);
  assert(v != current_);
  if (current_ != nullptr) {
    current_->Unref();
  }
  current_ = v;
  v->Ref();

  // Append to linked list
  v->prev_ = dummy_versions_.prev_;
  v->next_ = &dummy_versions_;
  v->prev_->next_ = v;
  v->next_->prev_ = v;
}